

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O3

void __thiscall script_p2sh_tests::AreInputsStandard::test_method(AreInputsStandard *this)

{
  uchar *puVar1;
  _Rb_tree_header *p_Var2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pbVar6;
  void *pvVar7;
  pointer pCVar8;
  pointer pCVar9;
  pointer pCVar10;
  pointer pCVar11;
  shared_count sVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  CScript *pCVar17;
  uint uVar18;
  CKey *pCVar19;
  iterator iVar20;
  int i;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar21;
  CScript *pCVar22;
  iterator in_R8;
  iterator pvVar23;
  iterator in_R9;
  iterator pvVar24;
  long lVar25;
  ulong uVar26;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b_05;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  const_string file_08;
  const_string file_09;
  span<const_std::byte,_18446744073709551615UL> b_08;
  const_string file_10;
  const_string file_11;
  span<const_std::byte,_18446744073709551615UL> b_09;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar28;
  char *pcVar27;
  undefined4 local_135c;
  undefined1 *local_1358;
  undefined1 *local_1350;
  char *local_1348;
  char *local_1340;
  char *local_1338;
  char *local_1330;
  undefined1 *local_1328;
  undefined1 *local_1320;
  char *local_1318;
  char *local_1310;
  uint local_1304;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12e0;
  char *local_12d8;
  undefined1 *local_12d0;
  undefined1 *local_12c8;
  char *local_12c0;
  char *local_12b8;
  CMutableTransaction txToNonStd1;
  undefined1 *local_1278;
  undefined1 *local_1270;
  char *local_1268;
  char *local_1260;
  char *local_1258;
  char *local_1250;
  undefined1 *local_1248;
  undefined1 *local_1240;
  char *local_1238;
  char *local_1230;
  char *local_1228;
  char *local_1220;
  undefined1 *local_1218;
  undefined1 *local_1210;
  char *local_1208;
  char *local_1200;
  char *local_11f8;
  char *local_11f0;
  undefined1 *local_11e8;
  undefined1 *local_11e0;
  char *local_11d8;
  char *local_11d0;
  char *local_11c8;
  char *local_11c0;
  undefined1 *local_11b8;
  undefined1 *local_11b0;
  char *local_11a8;
  char *local_11a0;
  CMutableTransaction txTo;
  char *local_1160;
  char *local_1158;
  undefined1 *local_1150;
  undefined1 *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  char *local_1128;
  undefined1 *local_1120;
  undefined1 *local_1118;
  char *local_1110;
  char *local_1108;
  char *local_1100;
  char *local_10f8;
  undefined1 *local_10f0;
  undefined1 *local_10e8;
  char *local_10e0;
  char *local_10d8;
  char *local_10d0;
  char *local_10c8;
  undefined1 *local_10c0;
  undefined1 *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_10a0;
  char *local_1098;
  undefined1 *local_1090;
  undefined1 *local_1088;
  char *local_1080;
  char *local_1078;
  CMutableTransaction txFrom;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  char *local_1018;
  char *local_1010;
  undefined1 *local_1008;
  undefined1 *local_1000;
  char *local_ff8;
  char *local_ff0;
  CCoinsView coinsDummy;
  undefined4 *local_fe0;
  undefined1 local_fd8 [8];
  undefined1 local_fd0 [16];
  assertion_result aStack_fc0;
  assertion_result local_fa8;
  char *local_f90;
  CMutableTransaction txToNonStd2;
  undefined1 local_f50 [8];
  element_type *local_f48;
  shared_count sStack_f40;
  CMutableTransaction *local_f38;
  undefined1 local_f08 [16];
  shared_count local_ef8;
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_ef0 [2];
  uchar local_ec0;
  SignatureData empty_c;
  SignatureData empty_b;
  SignatureData empty;
  undefined1 local_3d8 [28];
  uint uStack_3bc;
  undefined1 local_3b8 [28];
  uint uStack_39c;
  undefined1 local_398 [28];
  uint uStack_37c;
  undefined1 local_378 [28];
  uint uStack_35c;
  direct_or_indirect local_358;
  uint local_33c;
  direct_or_indirect local_338;
  uint local_31c;
  CKey key [6];
  FillableSigningProvider keystore;
  CCoinsViewCache coins;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  long local_38;
  
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  coinsDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_01398580;
  CCoinsViewCache::CCoinsViewCache(&coins,&coinsDummy,false);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01399e20;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  lVar16 = 8;
  do {
    local_338.direct[lVar16 + 0x18] = '\0';
    *(undefined8 *)(&key[0].fCompressed + lVar16) = 0;
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x68);
  lVar16 = 0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pCVar19 = (CKey *)(&key[0].fCompressed + lVar16);
    CKey::MakeNewKey(pCVar19,true);
    local_ff8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_ff0 = "";
    local_1008 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x11f;
    file.m_begin = (iterator)&local_ff8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1008,msg);
    CKey::GetPubKey((CPubKey *)&empty,pCVar19);
    iVar14 = (*keystore.super_SigningProvider._vptr_SigningProvider[10])(&keystore,pCVar19,&empty);
    empty_b.complete = SUB41(iVar14,0);
    empty_b.scriptSig.super_CScriptBase._union._0_4_ = 0;
    empty_b.scriptSig.super_CScriptBase._union._4_4_ = 0;
    empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity = 0;
    empty_b.scriptSig.super_CScriptBase._union._12_4_ = 0;
    empty_c._0_8_ = anon_var_dwarf_e815ea;
    empty_c.scriptSig.super_CScriptBase._union._0_4_ = 0xe8b090;
    empty_c.scriptSig.super_CScriptBase._union._4_4_ = 0;
    empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
         (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
                 0xffffffffffffff00);
    empty._0_8_ = &PTR__lazy_ostream_01389048;
    empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_1018 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_1010 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar28,
               (size_t)&local_1018,0x11f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x60);
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve(&keys,3);
  lVar16 = 0;
  do {
    CKey::GetPubKey((CPubKey *)&empty,(CKey *)(&key[0].fCompressed + lVar16));
    pCVar11 = keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
                (&keys,(iterator)
                       keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish,(CPubKey *)&empty);
    }
    else {
      memcpy(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish,&empty,0x41);
      keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_finish = pCVar11 + 1;
    }
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x30);
  CMutableTransaction::CMutableTransaction(&txFrom);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txFrom.vout,7);
  CKey::GetPubKey((CPubKey *)&empty_b,key);
  PKHash::PKHash((PKHash *)&empty_c,(CPubKey *)&empty_b);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT44(empty_c.scriptSig.super_CScriptBase._union._4_4_,
                        empty_c.scriptSig.super_CScriptBase._union._0_4_);
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x02';
  GetScriptForDestination((CScript *)&local_338.indirect_contents,(CTxDestination *)&empty);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  local_1080 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1078 = "";
  local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12b;
  file_00.m_begin = (iterator)&local_1080;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1090,
             msg_00);
  empty_b.complete =
       FillableSigningProvider::AddCScript(&keystore,(CScript *)&local_338.indirect_contents);
  empty_b.scriptSig.super_CScriptBase._union._0_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity = 0;
  empty_b.scriptSig.super_CScriptBase._union._12_4_ = 0;
  empty_c._0_8_ = anon_var_dwarf_144795b;
  empty_c.scriptSig.super_CScriptBase._union._0_4_ = 0xea3976;
  empty_c.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_01389048;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_10a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1098 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar28,
             (size_t)&local_10a0,299);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  GetScriptForMultisig((CScript *)&local_358.indirect_contents,1,&keys);
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,(CScript *)&local_338.indirect_contents);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT44(empty_c.scriptSig.super_CScriptBase._union._4_4_,
                        empty_c.scriptSig.super_CScriptBase._union._0_4_);
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  pCVar8 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar17 = &(txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptPubKey;
  if (0x1c < ((txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free((pCVar17->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0xc) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity,
                empty_b.scriptSig.super_CScriptBase._union._4_4_);
  *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0x14) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._16_4_,
                empty_b.scriptSig.super_CScriptBase._union._12_4_);
  (pCVar17->super_CScriptBase)._union.indirect_contents.indirect =
       (char *)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
  *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 8) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._4_4_,
                empty_b.scriptSig.super_CScriptBase._union._0_4_);
  (pCVar8->scriptPubKey).super_CScriptBase._size = empty_b.scriptSig.super_CScriptBase._union._20_4_
  ;
  empty_b.scriptSig.super_CScriptBase._union._20_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  (txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_338.indirect_contents);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 2000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_358.indirect_contents);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[2].nValue = 3000;
  local_378._16_8_ = 0;
  stack0xfffffffffffffca0 = 0;
  local_378._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_378._8_8_ = 0;
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378,(iterator)local_378,
             &empty.complete);
  pCVar19 = key;
  CKey::GetPubKey((CPubKey *)&empty,pCVar19);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f08,(CPubKey *)&empty);
  b._M_extent._M_extent_value = local_f08._8_8_ - local_f08._0_8_;
  b._M_ptr = (pointer)local_f08._0_8_;
  pCVar17 = CScript::operator<<((CScript *)local_378,b);
  CKey::GetPubKey((CPubKey *)&empty_b,key + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f50,(CPubKey *)&empty_b)
  ;
  b_00._M_extent._M_extent_value = (long)local_f48 - (long)local_f50;
  b_00._M_ptr = (pointer)local_f50;
  pCVar17 = CScript::operator<<(pCVar17,b_00);
  CKey::GetPubKey((CPubKey *)&empty_c,key + 2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo,(CPubKey *)&empty_c);
  b_01._M_extent._M_extent_value =
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_01._M_ptr = (pointer)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar17,b_01);
  if (txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f50 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f50,(long)sStack_f40.pi_ - (long)local_f50);
  }
  if ((pointer)local_f08._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f08._0_8_,(long)local_ef8.pi_ - local_f08._0_8_);
  }
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378._0_8_;
  uVar15 = uStack_35c - 0x1d;
  if (uStack_35c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378;
    uVar15 = uStack_35c;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378._0_8_;
  uVar15 = uStack_35c - 0x1d;
  if (uStack_35c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378;
    uVar15 = uStack_35c;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378._0_8_;
  uVar15 = uStack_35c - 0x1d;
  if (uStack_35c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378;
    uVar15 = uStack_35c;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  CKey::GetPubKey((CPubKey *)&empty,key + 3);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f08,(CPubKey *)&empty);
  b_02._M_extent._M_extent_value = local_f08._8_8_ - local_f08._0_8_;
  b_02._M_ptr = (pointer)local_f08._0_8_;
  pCVar17 = CScript::operator<<((CScript *)local_378,b_02);
  CKey::GetPubKey((CPubKey *)&empty_b,key + 4);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f50,(CPubKey *)&empty_b)
  ;
  b_03._M_extent._M_extent_value = (long)local_f48 - (long)local_f50;
  b_03._M_ptr = (pointer)local_f50;
  pCVar17 = CScript::operator<<(pCVar17,b_03);
  CKey::GetPubKey((CPubKey *)&empty_c,key + 5);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txTo,(CPubKey *)&empty_c);
  b_04._M_extent._M_extent_value =
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_04._M_ptr = (pointer)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start;
  CScript::operator<<(pCVar17,b_04);
  if (txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f50 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f50,(long)sStack_f40.pi_ - (long)local_f50);
  }
  if ((pointer)local_f08._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f08._0_8_,(long)local_ef8.pi_ - local_f08._0_8_);
  }
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378._0_8_;
  uVar15 = uStack_35c - 0x1d;
  if (uStack_35c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378;
    uVar15 = uStack_35c;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378._0_8_;
  uVar15 = uStack_35c - 0x1d;
  if (uStack_35c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378;
    uVar15 = uStack_35c;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_378,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  local_10b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10a8 = "";
  local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x13c;
  file_01.m_begin = (iterator)&local_10b0;
  msg_01.m_end = pvVar24;
  msg_01.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_10c0,
             msg_01);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,(CScript *)local_378);
  empty_b.scriptSig.super_CScriptBase._union._0_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity = 0;
  empty_b.scriptSig.super_CScriptBase._union._12_4_ = 0;
  empty_c._0_8_ = anon_var_dwarf_1447975;
  empty_c.scriptSig.super_CScriptBase._union._0_4_ = 0xea3995;
  empty_c.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_01389048;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_10d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10c8 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar28,
             (size_t)&local_10d0,0x13c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,(CScript *)local_378);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT44(empty_c.scriptSig.super_CScriptBase._union._4_4_,
                        empty_c.scriptSig.super_CScriptBase._union._0_4_);
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  pCVar10 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar8 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start + 3;
  if (0x1c < txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase._size) {
    free((pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&pCVar10[3].scriptPubKey.super_CScriptBase._union + 0xc) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity,
                empty_b.scriptSig.super_CScriptBase._union._4_4_);
  *(ulong *)((long)&pCVar10[3].scriptPubKey.super_CScriptBase._union + 0x14) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._16_4_,
                empty_b.scriptSig.super_CScriptBase._union._12_4_);
  (pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
  *(ulong *)((long)&pCVar10[3].scriptPubKey.super_CScriptBase._union + 8) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._4_4_,
                empty_b.scriptSig.super_CScriptBase._union._0_4_);
  pCVar10[3].scriptPubKey.super_CScriptBase._size =
       empty_b.scriptSig.super_CScriptBase._union._20_4_;
  empty_b.scriptSig.super_CScriptBase._union._20_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[3].nValue = 4000;
  local_398._16_8_ = 0;
  stack0xfffffffffffffc80 = 0;
  local_398._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_398._8_8_ = 0;
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             &empty.complete);
  iVar14 = 0xf;
  uVar26 = 0;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar26;
    CKey::GetPubKey((CPubKey *)&empty,
                    (CKey *)((long)pCVar19 +
                            (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                            -0x18));
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_b,(CPubKey *)&empty);
    pbVar6 = (pointer)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
    b_05._M_extent._M_extent_value =
         CONCAT44(empty_b.scriptSig.super_CScriptBase._union._4_4_,
                  empty_b.scriptSig.super_CScriptBase._union._0_4_) - (long)pbVar6;
    b_05._M_ptr = pbVar6;
    CScript::operator<<((CScript *)local_398,b_05);
    pvVar7 = (void *)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,CONCAT44(empty_b.scriptSig.super_CScriptBase._union._12_4_,
                                      empty_b.scriptSig.super_CScriptBase._union.indirect_contents.
                                      capacity) - (long)pvVar7);
    }
    pCVar19 = pCVar19 + 1;
    uVar26 = uVar26 + 1;
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  uVar15 = uStack_37c - 0x1d;
  if (uStack_37c < 0x1d) {
    uVar15 = uStack_37c;
  }
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398._0_8_;
  if (uStack_37c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398._0_8_;
  uVar15 = uStack_37c - 0x1d;
  if (uStack_37c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398;
    uVar15 = uStack_37c;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  local_10e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10d8 = "";
  local_10f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x145;
  file_02.m_begin = (iterator)&local_10e0;
  msg_02.m_end = pvVar24;
  msg_02.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_10f0,
             msg_02);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,(CScript *)local_398);
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  empty_b.scriptSig.super_CScriptBase._union._0_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity = 0;
  empty_b.scriptSig.super_CScriptBase._union._12_4_ = 0;
  empty_c._0_8_ = anon_var_dwarf_14479a4;
  empty_c.scriptSig.super_CScriptBase._union._0_4_ = 0xea39b8;
  empty_c.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_01389048;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_10f8 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar28,
             (size_t)&local_1100,0x145);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,(CScript *)local_398);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT44(empty_c.scriptSig.super_CScriptBase._union._4_4_,
                        empty_c.scriptSig.super_CScriptBase._union._0_4_);
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  pCVar10 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar8 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start + 4;
  if (0x1c < txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start[4].scriptPubKey.super_CScriptBase._size) {
    free((pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&pCVar10[4].scriptPubKey.super_CScriptBase._union + 0xc) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity,
                empty_b.scriptSig.super_CScriptBase._union._4_4_);
  *(ulong *)((long)&pCVar10[4].scriptPubKey.super_CScriptBase._union + 0x14) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._16_4_,
                empty_b.scriptSig.super_CScriptBase._union._12_4_);
  (pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
  *(ulong *)((long)&pCVar10[4].scriptPubKey.super_CScriptBase._union + 8) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._4_4_,
                empty_b.scriptSig.super_CScriptBase._union._0_4_);
  pCVar10[4].scriptPubKey.super_CScriptBase._size =
       empty_b.scriptSig.super_CScriptBase._union._20_4_;
  empty_b.scriptSig.super_CScriptBase._union._20_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[4].nValue = 5000;
  local_3b8._16_8_ = 0;
  stack0xfffffffffffffc60 = 0;
  local_3b8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_3b8._8_8_ = 0;
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_3b8,(iterator)local_3b8,
             &empty.complete);
  ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_3b8._0_8_;
  uVar15 = uStack_39c - 0x1d;
  if (uStack_39c < 0x1d) {
    ppVar21 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_3b8;
    uVar15 = uStack_39c;
  }
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_3b8,
             (uchar *)((long)&ppVar21->_union + (long)(int)uVar15),&empty.complete);
  local_1110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1108 = "";
  local_1120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x14b;
  file_03.m_begin = (iterator)&local_1110;
  msg_03.m_end = pvVar24;
  msg_03.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1120,
             msg_03);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,(CScript *)local_3b8);
  empty_b.scriptSig.super_CScriptBase._union._0_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity = 0;
  empty_b.scriptSig.super_CScriptBase._union._12_4_ = 0;
  empty_c._0_8_ = anon_var_dwarf_14479be;
  empty_c.scriptSig.super_CScriptBase._union._0_4_ = 0xea39db;
  empty_c.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_01389048;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1128 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar28,
             (size_t)&local_1130,0x14b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,(CScript *)local_3b8);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT44(empty_c.scriptSig.super_CScriptBase._union._4_4_,
                        empty_c.scriptSig.super_CScriptBase._union._0_4_);
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  pCVar10 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar8 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start + 5;
  if (0x1c < txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start[5].scriptPubKey.super_CScriptBase._size) {
    free((pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&pCVar10[5].scriptPubKey.super_CScriptBase._union + 0xc) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity,
                empty_b.scriptSig.super_CScriptBase._union._4_4_);
  *(ulong *)((long)&pCVar10[5].scriptPubKey.super_CScriptBase._union + 0x14) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._16_4_,
                empty_b.scriptSig.super_CScriptBase._union._12_4_);
  (pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
  *(ulong *)((long)&pCVar10[5].scriptPubKey.super_CScriptBase._union + 8) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._4_4_,
                empty_b.scriptSig.super_CScriptBase._union._0_4_);
  pCVar10[5].scriptPubKey.super_CScriptBase._size =
       empty_b.scriptSig.super_CScriptBase._union._20_4_;
  empty_b.scriptSig.super_CScriptBase._union._20_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[5].nValue = 5000;
  local_3d8._16_8_ = 0;
  stack0xfffffffffffffc40 = 0;
  local_3d8._0_8_ = (uchar *)0x0;
  local_3d8._8_8_ = 0;
  empty.complete = true;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_3d8,(iterator)local_3d8,
             &empty.complete);
  local_1140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1138 = "";
  local_1150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x14f;
  file_04.m_begin = (iterator)&local_1140;
  msg_04.m_end = pvVar24;
  msg_04.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1150,
             msg_04);
  empty_b.complete = FillableSigningProvider::AddCScript(&keystore,(CScript *)local_3d8);
  empty_b.scriptSig.super_CScriptBase._union._0_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity = 0;
  empty_b.scriptSig.super_CScriptBase._union._12_4_ = 0;
  empty_c._0_8_ = anon_var_dwarf_14479ca;
  empty_c.scriptSig.super_CScriptBase._union._0_4_ = 0xea39fd;
  empty_c.scriptSig.super_CScriptBase._union._4_4_ = 0;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  empty._0_8_ = &PTR__lazy_ostream_01389048;
  empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1158 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = &empty_c;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&empty_b,(lazy_ostream *)&empty,1,0,WARN,_cVar28,
             (size_t)&local_1160,0x14f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&empty_b.scriptSig.super_CScriptBase._union + 8));
  ScriptHash::ScriptHash((ScriptHash *)&empty_c,(CScript *)local_3d8);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity =
       empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT44(empty_c.scriptSig.super_CScriptBase._union._4_4_,
                        empty_c.scriptSig.super_CScriptBase._union._0_4_);
  empty.complete = empty_c.complete;
  empty.witness = empty_c.witness;
  empty._2_6_ = empty_c._2_6_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination((CScript *)&empty_b,(CTxDestination *)&empty);
  pCVar10 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar8 = txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start + 6;
  if (0x1c < txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start[6].scriptPubKey.super_CScriptBase._size) {
    free((pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&pCVar10[6].scriptPubKey.super_CScriptBase._union + 0xc) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union.indirect_contents.capacity,
                empty_b.scriptSig.super_CScriptBase._union._4_4_);
  *(ulong *)((long)&pCVar10[6].scriptPubKey.super_CScriptBase._union + 0x14) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._16_4_,
                empty_b.scriptSig.super_CScriptBase._union._12_4_);
  (pCVar8->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT62(empty_b._2_6_,CONCAT11(empty_b.witness,empty_b.complete));
  *(ulong *)((long)&pCVar10[6].scriptPubKey.super_CScriptBase._union + 8) =
       CONCAT44(empty_b.scriptSig.super_CScriptBase._union._4_4_,
                empty_b.scriptSig.super_CScriptBase._union._0_4_);
  pCVar10[6].scriptPubKey.super_CScriptBase._size =
       empty_b.scriptSig.super_CScriptBase._union._20_4_;
  empty_b.scriptSig.super_CScriptBase._union._20_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[6].nValue = 6000;
  CTransaction::CTransaction((CTransaction *)&empty,&txFrom);
  AddCoins(&coins,(CTransaction *)&empty,0,false);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             ((long)&empty.scriptSig.super_CScriptBase._union + 0x10));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&empty);
  CMutableTransaction::CMutableTransaction(&txTo);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txTo.vout,1);
  CKey::GetPubKey((CPubKey *)&empty_b,key + 1);
  PKHash::PKHash((PKHash *)local_f08,(CPubKey *)&empty_b);
  empty.scriptSig.super_CScriptBase._union.indirect_contents.capacity = local_ef8.pi_._0_4_;
  empty.complete = (bool)local_f08[0];
  empty.witness = (bool)local_f08[1];
  empty._2_6_ = local_f08._2_6_;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)local_f08._8_8_;
  empty.witness_script.super_CScriptBase._union.direct[0] = '\x02';
  GetScriptForDestination((CScript *)&empty_c,(CTxDestination *)&empty);
  if (0x1c < ((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free(((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union.
         indirect_contents.indirect);
  }
  *(ulong *)((long)&((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union +
            0xc) =
       CONCAT44(empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity,
                empty_c.scriptSig.super_CScriptBase._union._4_4_);
  *(ulong *)((long)&((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union +
            0x14) =
       CONCAT44(empty_c.scriptSig.super_CScriptBase._union._16_4_,
                empty_c.scriptSig.super_CScriptBase._union._12_4_);
  ((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
   _M_start)->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect =
       (char *)empty_c._0_8_;
  *(ulong *)((long)&((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union + 8)
       = CONCAT44(empty_c.scriptSig.super_CScriptBase._union._4_4_,
                  empty_c.scriptSig.super_CScriptBase._union._0_4_);
  ((txTo.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
   _M_start)->scriptPubKey).super_CScriptBase._size =
       empty_c.scriptSig.super_CScriptBase._union._20_4_;
  empty_c.scriptSig.super_CScriptBase._union._20_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&empty);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txTo.vin,5);
  lVar25 = 0;
  lVar16 = 0;
  do {
    *(int *)((long)(&((txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout).hash + 1) + lVar25) = (int)lVar16
    ;
    CMutableTransaction::GetHash((Txid *)&empty,&txFrom);
    puVar1 = ((txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar25 + 0x10;
    *(undefined8 *)puVar1 = empty.scriptSig.super_CScriptBase._union._8_8_;
    *(undefined8 *)(puVar1 + 8) = empty.scriptSig.super_CScriptBase._union._16_8_;
    puVar1 = ((txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + lVar25;
    puVar1[0] = empty.complete;
    puVar1[1] = empty.witness;
    puVar1[2] = empty._2_1_;
    puVar1[3] = empty._3_1_;
    puVar1[4] = empty._4_1_;
    puVar1[5] = empty._5_1_;
    puVar1[6] = empty._6_1_;
    puVar1[7] = empty._7_1_;
    *(char **)(puVar1 + 8) = empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect;
    lVar16 = lVar16 + 1;
    lVar25 = lVar25 + 0x68;
  } while (lVar16 != 5);
  empty._0_8_ = empty._0_8_ & 0xffffffffffff0000;
  p_Var2 = &empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  memset(&empty.scriptSig,0,0xb8);
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_11a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11a0 = "";
  local_11b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x160;
  file_05.m_begin = (iterator)&local_11a8;
  msg_05.m_end = pvVar24;
  msg_05.m_begin = pvVar23;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_11b8,
             msg_05);
  CTransaction::CTransaction((CTransaction *)&empty_b,&txFrom);
  bVar13 = SignSignature(&keystore.super_SigningProvider,(CTransaction *)&empty_b,&txTo,0,1,&empty);
  local_f08[0] = bVar13;
  local_f08._8_8_ = (element_type *)0x0;
  local_ef8.pi_ = (sp_counted_base *)0x0;
  local_f50 = (undefined1  [8])0xea39fe;
  local_f48 = (element_type *)0xea3a48;
  empty_c.scriptSig.super_CScriptBase._union._0_4_ =
       empty_c.scriptSig.super_CScriptBase._union._0_4_ & 0xffffff00;
  empty_c._0_8_ = &PTR__lazy_ostream_01389048;
  empty_c.scriptSig.super_CScriptBase._union.indirect_contents.capacity = 0x139d138;
  empty_c.scriptSig.super_CScriptBase._union._12_4_ = 0;
  local_11c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11c0 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  empty_c.scriptSig.super_CScriptBase._union._16_8_ = local_f50;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f08,(lazy_ostream *)&empty_c,1,0,WARN,_cVar28,
             (size_t)&local_11c8,0x160);
  boost::detail::shared_count::~shared_count(&local_ef8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             ((long)&empty_b.scriptSig.super_CScriptBase._union + 0x10));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&empty_b);
  empty_b.complete = false;
  empty_b.witness = false;
  p_Var2 = &empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&empty_b.scriptSig,0,0xb8);
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty_b.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_b.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  empty_b.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  empty_b.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  empty_b.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  empty_b.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_b.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_b.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_b.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_11d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11d0 = "";
  local_11e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x162;
  file_06.m_begin = (iterator)&local_11d8;
  msg_06.m_end = pvVar24;
  msg_06.m_begin = pvVar23;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  empty_b.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_b.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_11e8,
             msg_06);
  CTransaction::CTransaction((CTransaction *)&empty_c,&txFrom);
  bVar13 = SignSignature(&keystore.super_SigningProvider,(CTransaction *)&empty_c,&txTo,1,1,&empty_b
                        );
  local_f50[0] = bVar13;
  local_f48 = (element_type *)0x0;
  sStack_f40.pi_ = (sp_counted_base *)0x0;
  avStack_ef0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)&txToNonStd1;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_14479fe;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea3a95;
  local_f08._8_8_ = local_f08._8_8_ & 0xffffffffffffff00;
  local_f08._0_8_ = &PTR__lazy_ostream_01389048;
  local_ef8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_11f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_11f0 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f50,(lazy_ostream *)local_f08,1,0,WARN,_cVar28,
             (size_t)&local_11f8,0x162);
  boost::detail::shared_count::~shared_count(&sStack_f40);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             ((long)&empty_c.scriptSig.super_CScriptBase._union + 0x10));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&empty_c);
  empty_c._0_8_ = empty_c._0_8_ & 0xffffffffffff0000;
  p_Var2 = &empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&empty_c.scriptSig,0,0xb8);
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty_c.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_c.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  empty_c.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  empty_c.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  empty_c.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  empty_c.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_c.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_c.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_c.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1200 = "";
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x164;
  file_07.m_begin = (iterator)&local_1208;
  msg_07.m_end = pvVar24;
  msg_07.m_begin = pvVar23;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  empty_c.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty_c.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_1218,
             msg_07);
  CTransaction::CTransaction((CTransaction *)local_f08,&txFrom);
  bVar13 = SignSignature(&keystore.super_SigningProvider,(CTransaction *)local_f08,&txTo,2,1,
                         &empty_c);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar13);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1447a18;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0xea3ae2;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  local_f48 = (element_type *)((ulong)local_f48 & 0xffffffffffffff00);
  local_f50 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_f40.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1220 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  local_f38 = &txToNonStd2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txToNonStd1,(lazy_ostream *)local_f50,1,0,WARN,_cVar28,
             (size_t)&local_1228,0x164);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_ef0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f08);
  pCVar9 = txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar17 = &txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[3].scriptSig;
  uVar15 = txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start[3].scriptSig.super_CScriptBase._size;
  uVar18 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar18 = uVar15;
  }
  pCVar22 = (CScript *)
            txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[3].scriptSig.super_CScriptBase._union.indirect_contents
            .indirect;
  if (uVar15 < 0x1d) {
    pCVar22 = pCVar17;
  }
  local_f08[0] = (class_property<bool>)0x5b;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&pCVar17->super_CScriptBase,
             (uchar *)((long)&(pCVar22->super_CScriptBase)._union + (long)(int)uVar18),local_f08);
  uVar15 = pCVar9[3].scriptSig.super_CScriptBase._size;
  uVar18 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar18 = uVar15;
  }
  pCVar22 = (CScript *)pCVar9[3].scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  if (uVar15 < 0x1d) {
    pCVar22 = pCVar17;
  }
  local_f08[0] = 0x5b;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&pCVar17->super_CScriptBase,
             (uchar *)((long)&(pCVar22->super_CScriptBase)._union + (long)(int)uVar18),local_f08);
  iVar20.ptr = local_378;
  uVar15 = uStack_35c;
  if (0x1c < uStack_35c) {
    iVar20.ptr = (uchar *)local_378._0_8_;
    uVar15 = uStack_35c - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f08,iVar20,
             (iterator)(iVar20.ptr + (int)uVar15),(allocator_type *)local_f50);
  b_06._M_extent._M_extent_value = local_f08._8_8_ - local_f08._0_8_;
  b_06._M_ptr = (pointer)local_f08._0_8_;
  CScript::operator<<(pCVar17,b_06);
  if ((pointer)local_f08._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f08._0_8_,(long)local_ef8.pi_ - local_f08._0_8_);
  }
  iVar20.ptr = (uchar *)local_398;
  uVar15 = uStack_37c;
  if (0x1c < uStack_37c) {
    iVar20.ptr = (uchar *)local_398._0_8_;
    uVar15 = uStack_37c - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f08,iVar20,
             (iterator)(iVar20.ptr + (int)uVar15),(allocator_type *)local_f50);
  b_07._M_extent._M_extent_value = local_f08._8_8_ - local_f08._0_8_;
  b_07._M_ptr = (pointer)local_f08._0_8_;
  CScript::operator<<(&txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start[4].scriptSig,b_07);
  if ((pointer)local_f08._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f08._0_8_,(long)local_ef8.pi_ - local_f08._0_8_);
  }
  local_1238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1230 = "";
  local_1248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x16b;
  file_08.m_begin = (iterator)&local_1238;
  msg_08.m_end = pvVar24;
  msg_08.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_1248,
             msg_08);
  CTransaction::CTransaction((CTransaction *)local_f08,&txTo);
  bVar13 = ::AreInputsStandard((CTransaction *)local_f08,&coins);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar13);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1447a24;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0xea3b11;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  local_f48 = (element_type *)((ulong)local_f48 & 0xffffffffffffff00);
  local_f50 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_f40.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1250 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  local_f38 = &txToNonStd2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txToNonStd1,(lazy_ostream *)local_f50,1,0,WARN,_cVar28,
             (size_t)&local_1258,0x16b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_ef0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f08);
  local_1268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1260 = "";
  local_1278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x16d;
  file_09.m_begin = (iterator)&local_1268;
  msg_09.m_end = pvVar24;
  msg_09.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_1278,
             msg_09);
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ =
       (uint)txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01388f08;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x139d138;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xf4aea1;
  txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  CTransaction::CTransaction((CTransaction *)local_f08,&txTo);
  local_fd8._0_4_ = GetP2SHSigOpCount((CTransaction *)local_f08,&coins);
  aStack_fc0._0_8_ = local_fd8;
  local_fd0._0_8_ = &local_fe0;
  local_58[0] = local_fd8._0_4_ == 0x16;
  local_fe0 = (undefined4 *)CONCAT44(local_fe0._4_4_,0x16);
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58._20_4_ = 0;
  local_fa8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_fa8.m_message.px = (element_type *)0xea36c5;
  local_f38 = (CMutableTransaction *)&aStack_fc0;
  local_f48 = (element_type *)((ulong)local_f48 & 0xffffffffffffff00);
  local_f50 = (undefined1  [8])&PTR__lazy_ostream_01388f88;
  sStack_f40.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01388f88;
  txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  pcVar27 = "GetP2SHSigOpCount(CTransaction(txTo), coins)";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x2;
  txToNonStd1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_fd0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&txToNonStd2,1,2,REQUIRE,0xea3b12,
             (size_t)&local_fa8,0x16d,(lazy_ostream *)local_f50,"22U",&txToNonStd1);
  boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_ef0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f08);
  CMutableTransaction::CMutableTransaction(&txToNonStd1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txToNonStd1.vout,1);
  CKey::GetPubKey((CPubKey *)local_f50,key + 1);
  PKHash::PKHash((PKHash *)local_58,(CPubKey *)local_f50);
  local_ef8.pi_._0_4_ = local_58._16_4_;
  local_f08._8_8_ = CONCAT44(local_58._12_4_,local_58._8_4_);
  local_f08._0_8_ = local_58._0_8_;
  local_ec0 = '\x02';
  GetScriptForDestination((CScript *)&txToNonStd2,(CTxDestination *)local_f08);
  pCVar8 = txToNonStd1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar17 = &(txToNonStd1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptPubKey;
  if (0x1c < ((txToNonStd1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free((pCVar17->super_CScriptBase)._union.indirect_contents.indirect);
  }
  pCVar9 = txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = CONCAT44(txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_4_,
                   (uint)txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish);
  uVar5 = CONCAT44(txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._0_4_,
                   txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0xc) =
       CONCAT44(txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_,
                txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_);
  *(undefined8 *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0x14) = uVar5;
  (pCVar17->super_CScriptBase)._union.indirect_contents.indirect = (char *)pCVar9;
  *(undefined8 *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 8) = uVar4;
  (pCVar8->scriptPubKey).super_CScriptBase._size =
       txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_f08);
  (txToNonStd1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 1000;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txToNonStd1.vin,1);
  ((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start)->prevout).n = 5;
  CMutableTransaction::GetHash((Txid *)local_f08,&txFrom);
  pCVar9 = txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(sp_counted_base **)
   (((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_ef8.pi_;
  *(pointer *)
   (((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) =
       avStack_ef0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(undefined8 *)
   ((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
   _M_elems = local_f08._0_8_;
  *(undefined8 *)
   (((txToNonStd1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = local_f08._8_8_;
  iVar20.ptr = (uchar *)local_3b8;
  uVar15 = uStack_39c;
  if (0x1c < uStack_39c) {
    iVar20.ptr = (uchar *)local_3b8._0_8_;
    uVar15 = uStack_39c - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f08,iVar20,
             (iterator)(iVar20.ptr + (int)uVar15),(allocator_type *)local_f50);
  b_08._M_extent._M_extent_value = local_f08._8_8_ - local_f08._0_8_;
  b_08._M_ptr = (pointer)local_f08._0_8_;
  CScript::operator<<(&pCVar9->scriptSig,b_08);
  if ((pointer)local_f08._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f08._0_8_,(long)local_ef8.pi_ - local_f08._0_8_);
  }
  local_12c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_12b8 = "";
  local_12d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x178;
  file_10.m_begin = (iterator)&local_12c0;
  msg_10.m_end = pvVar24;
  msg_10.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_12d0,
             msg_10);
  CTransaction::CTransaction((CTransaction *)local_f08,&txToNonStd1);
  bVar13 = ::AreInputsStandard((CTransaction *)local_f08,&coins);
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar13);
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_58._0_8_ = "!::AreInputsStandard(CTransaction(txToNonStd1), coins)";
  local_58._8_4_ = 0xea3b79;
  local_58._12_4_ = 0;
  local_f48 = (element_type *)((ulong)local_f48 & 0xffffffffffffff00);
  local_f50 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_f40.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_12e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_12d8 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  local_f38 = (CMutableTransaction *)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txToNonStd2,(lazy_ostream *)local_f50,1,0,WARN,(check_type)pcVar27
             ,(size_t)&local_12e0,0x178);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_ef0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f08);
  local_12f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_12e8 = "";
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x179;
  file_11.m_begin = (iterator)&local_12f0;
  msg_11.m_end = pvVar24;
  msg_11.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_1300,
             msg_11);
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f08;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  uStack_40._0_4_ = 0xf4aea1;
  uStack_40._4_4_ = 0;
  CTransaction::CTransaction((CTransaction *)local_f08,&txToNonStd1);
  uVar15 = GetP2SHSigOpCount((CTransaction *)local_f08,&coins);
  local_fe0 = (undefined4 *)CONCAT44(local_fe0._4_4_,uVar15);
  local_1304 = 0x10;
  local_fa8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(uVar15 == 0x10);
  local_fa8.m_message.px = (element_type *)0x0;
  local_fa8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  aStack_fc0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  aStack_fc0.m_message.px =
       (element_type *)
       ((long)
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
       + 0x6a);
  local_fd0._0_8_ = &local_fe0;
  local_f48 = (element_type *)((ulong)local_f48 & 0xffffffffffffff00);
  local_f50 = (undefined1  [8])&PTR__lazy_ostream_01388f88;
  sStack_f40.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ =
       (uint)txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_01388f88;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x139d138;
  txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_fd8;
  pcVar27 = "GetP2SHSigOpCount(CTransaction(txToNonStd1), coins)";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x2;
  local_fd8 = (undefined1  [8])&local_1304;
  local_f38 = (CMutableTransaction *)local_fd0;
  boost::test_tools::tt_detail::report_assertion
            (&local_fa8,(lazy_ostream *)local_58,1,2,REQUIRE,0xea3b7a,(size_t)&aStack_fc0,0x179,
             (lazy_ostream *)local_f50,"16U",&txToNonStd2);
  boost::detail::shared_count::~shared_count(&local_fa8.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_ef0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f08);
  CMutableTransaction::CMutableTransaction(&txToNonStd2);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txToNonStd2.vout,1);
  CKey::GetPubKey((CPubKey *)local_f50,key + 1);
  PKHash::PKHash((PKHash *)&local_fa8,(CPubKey *)local_f50);
  sVar12.pi_ = local_fa8.m_message.pn.pi_;
  local_ef8.pi_._0_1_ = (uchar)local_fa8.m_message.pn.pi_;
  local_ef8.pi_._1_1_ = local_fa8.m_message.pn.pi_._1_1_;
  local_ef8.pi_._2_1_ = local_fa8.m_message.pn.pi_._2_1_;
  local_ef8.pi_._3_1_ = local_fa8.m_message.pn.pi_._3_1_;
  local_f08._0_8_ = local_fa8._0_8_;
  local_f08._8_8_ = local_fa8.m_message.px;
  local_ec0 = '\x02';
  local_fa8.m_message.pn.pi_ = sVar12.pi_;
  GetScriptForDestination((CScript *)local_58,(CTxDestination *)local_f08);
  pCVar8 = txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar17 = &(txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptPubKey;
  if (0x1c < ((txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free((pCVar17->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0xc) =
       CONCAT44(local_58._16_4_,local_58._12_4_);
  *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0x14) =
       CONCAT44((undefined4)uStack_40,local_58._20_4_);
  (pCVar17->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_58._0_8_;
  *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 8) =
       CONCAT44(local_58._12_4_,local_58._8_4_);
  (pCVar8->scriptPubKey).super_CScriptBase._size = uStack_40._4_4_;
  uStack_40._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_f08);
  (txToNonStd2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 1000;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txToNonStd2.vin,1);
  ((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start)->prevout).n = 6;
  CMutableTransaction::GetHash((Txid *)local_f08,&txFrom);
  pCVar9 = txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(sp_counted_base **)
   (((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_ef8.pi_;
  *(pointer *)
   (((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) =
       avStack_ef0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(undefined8 *)
   ((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
   _M_elems = local_f08._0_8_;
  *(undefined8 *)
   (((txToNonStd2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = local_f08._8_8_;
  iVar20.ptr = local_3d8;
  uVar15 = uStack_3bc;
  if (0x1c < uStack_3bc) {
    iVar20.ptr = (uchar *)local_3d8._0_8_;
    uVar15 = uStack_3bc - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f08,iVar20,
             (iterator)(iVar20.ptr + (int)uVar15),(allocator_type *)local_f50);
  b_09._M_extent._M_extent_value = local_f08._8_8_ - local_f08._0_8_;
  b_09._M_ptr = (pointer)local_f08._0_8_;
  CScript::operator<<(&pCVar9->scriptSig,b_09);
  if ((pointer)local_f08._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f08._0_8_,(long)local_ef8.pi_ - local_f08._0_8_);
  }
  local_1318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1310 = "";
  local_1328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x184;
  file_12.m_begin = (iterator)&local_1318;
  msg_12.m_end = pvVar24;
  msg_12.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_1328,
             msg_12);
  CTransaction::CTransaction((CTransaction *)local_f08,&txToNonStd2);
  bVar13 = ::AreInputsStandard((CTransaction *)local_f08,&coins);
  local_58[0] = !bVar13;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58._20_4_ = 0;
  local_fa8._0_8_ = "!::AreInputsStandard(CTransaction(txToNonStd2), coins)";
  local_fa8.m_message.px = (element_type *)0xea3be4;
  local_f48 = (element_type *)((ulong)local_f48 & 0xffffffffffffff00);
  local_f50 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  sStack_f40.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1330 = "";
  pvVar23 = (iterator)0x1;
  pvVar24 = (iterator)0x0;
  local_f38 = (CMutableTransaction *)&local_fa8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_f50,1,0,WARN,(check_type)pcVar27,
             (size_t)&local_1338,0x184);
  boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_ef0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f08);
  local_1348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1340 = "";
  local_1358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x185;
  file_13.m_begin = (iterator)&local_1348;
  msg_13.m_end = pvVar24;
  msg_13.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_1358,
             msg_13);
  local_fa8.m_message.px = (element_type *)((ulong)local_fa8.m_message.px & 0xffffffffffffff00);
  local_fa8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_fa8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f90 = "";
  CTransaction::CTransaction((CTransaction *)local_f08,&txToNonStd2);
  local_1304 = GetP2SHSigOpCount((CTransaction *)local_f08,&coins);
  local_fe0 = &local_135c;
  local_135c = 0x14;
  aStack_fc0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_1304 == 0x14);
  aStack_fc0.m_message.px = (element_type *)0x0;
  aStack_fc0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_fd0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_fd0._8_8_ = "";
  local_f48 = (element_type *)((ulong)local_f48 & 0xffffffffffffff00);
  local_f50 = (undefined1  [8])&PTR__lazy_ostream_01388f88;
  sStack_f40.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f38 = (CMutableTransaction *)local_fd8;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01388f88;
  local_58[0x10] = '8';
  local_58[0x11] = 0xd1;
  local_58[0x12] = '9';
  local_58[0x13] = '\x01';
  local_58._20_4_ = 0;
  uStack_40 = &local_fe0;
  local_fd8 = (undefined1  [8])&local_1304;
  boost::test_tools::tt_detail::report_assertion
            (&aStack_fc0,(lazy_ostream *)&local_fa8,1,2,REQUIRE,0xea3be5,(size_t)local_fd0,0x185,
             (lazy_ostream *)local_f50,"20U",(assertion_result *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&aStack_fc0 + 0x10));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_ef0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f08);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txToNonStd2.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txToNonStd2.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txToNonStd1.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txToNonStd1.vin);
  SignatureData::~SignatureData(&empty_c);
  SignatureData::~SignatureData(&empty_b);
  SignatureData::~SignatureData(&empty);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txTo.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txTo.vin);
  if (0x1c < uStack_3bc) {
    free((void *)local_3d8._0_8_);
  }
  if (0x1c < uStack_39c) {
    free((void *)local_3b8._0_8_);
  }
  if (0x1c < uStack_37c) {
    free((void *)local_398._0_8_);
  }
  if (0x1c < uStack_35c) {
    free((void *)local_378._0_8_);
  }
  if (0x1c < local_33c) {
    free(local_358.indirect_contents.indirect);
  }
  if (0x1c < local_31c) {
    free(local_338.indirect_contents.indirect);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txFrom.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txFrom.vin);
  if (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar16 = 0x58;
  do {
    if (*(array<unsigned_char,_32UL> **)(&key[0].fCompressed + lVar16) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                 (&key[0].fCompressed + lVar16),
                 *(array<unsigned_char,_32UL> **)(&key[0].fCompressed + lVar16));
    }
    *(undefined8 *)(&key[0].fCompressed + lVar16) = 0;
    lVar16 = lVar16 + -0x10;
  } while (lVar16 != -8);
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01399e20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&keystore.mapScripts._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&keystore.mapKeys._M_t);
  coins.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_01398500;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&coins.cacheCoins._M_h);
  if (coins.m_sentinel.second.m_flags != '\0') {
    ((coins.m_sentinel.second.m_next)->second).m_prev = coins.m_sentinel.second.m_prev;
    ((coins.m_sentinel.second.m_prev)->second).m_next = coins.m_sentinel.second.m_next;
    coins.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
         indirect);
    coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
    indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource(&coins.m_cache_coins_memory_resource);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(AreInputsStandard)
{
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    FillableSigningProvider keystore;
    CKey key[6];
    for (int i = 0; i < 6; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }
    std::vector<CPubKey> keys;
    keys.reserve(3);
    for (int i = 0; i < 3; i++)
        keys.push_back(key[i].GetPubKey());

    CMutableTransaction txFrom;
    txFrom.vout.resize(7);

    // First three are standard:
    CScript pay1 = GetScriptForDestination(PKHash(key[0].GetPubKey()));
    BOOST_CHECK(keystore.AddCScript(pay1));
    CScript pay1of3 = GetScriptForMultisig(1, keys);

    txFrom.vout[0].scriptPubKey = GetScriptForDestination(ScriptHash(pay1)); // P2SH (OP_CHECKSIG)
    txFrom.vout[0].nValue = 1000;
    txFrom.vout[1].scriptPubKey = pay1; // ordinary OP_CHECKSIG
    txFrom.vout[1].nValue = 2000;
    txFrom.vout[2].scriptPubKey = pay1of3; // ordinary OP_CHECKMULTISIG
    txFrom.vout[2].nValue = 3000;

    // vout[3] is complicated 1-of-3 AND 2-of-3
    // ... that is OK if wrapped in P2SH:
    CScript oneAndTwo;
    oneAndTwo << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey());
    oneAndTwo << OP_3 << OP_CHECKMULTISIGVERIFY;
    oneAndTwo << OP_2 << ToByteVector(key[3].GetPubKey()) << ToByteVector(key[4].GetPubKey()) << ToByteVector(key[5].GetPubKey());
    oneAndTwo << OP_3 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(oneAndTwo));
    txFrom.vout[3].scriptPubKey = GetScriptForDestination(ScriptHash(oneAndTwo));
    txFrom.vout[3].nValue = 4000;

    // vout[4] is max sigops:
    CScript fifteenSigops; fifteenSigops << OP_1;
    for (unsigned i = 0; i < MAX_P2SH_SIGOPS; i++)
        fifteenSigops << ToByteVector(key[i%3].GetPubKey());
    fifteenSigops << OP_15 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(fifteenSigops));
    txFrom.vout[4].scriptPubKey = GetScriptForDestination(ScriptHash(fifteenSigops));
    txFrom.vout[4].nValue = 5000;

    // vout[5/6] are non-standard because they exceed MAX_P2SH_SIGOPS
    CScript sixteenSigops; sixteenSigops << OP_16 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(sixteenSigops));
    txFrom.vout[5].scriptPubKey = GetScriptForDestination(ScriptHash(sixteenSigops));
    txFrom.vout[5].nValue = 5000;
    CScript twentySigops; twentySigops << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(twentySigops));
    txFrom.vout[6].scriptPubKey = GetScriptForDestination(ScriptHash(twentySigops));
    txFrom.vout[6].nValue = 6000;

    AddCoins(coins, CTransaction(txFrom), 0);

    CMutableTransaction txTo;
    txTo.vout.resize(1);
    txTo.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));

    txTo.vin.resize(5);
    for (int i = 0; i < 5; i++)
    {
        txTo.vin[i].prevout.n = i;
        txTo.vin[i].prevout.hash = txFrom.GetHash();
    }
    SignatureData empty;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 0, SIGHASH_ALL, empty));
    SignatureData empty_b;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 1, SIGHASH_ALL, empty_b));
    SignatureData empty_c;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 2, SIGHASH_ALL, empty_c));
    // SignSignature doesn't know how to sign these. We're
    // not testing validating signatures, so just create
    // dummy signatures that DO include the correct P2SH scripts:
    txTo.vin[3].scriptSig << OP_11 << OP_11 << std::vector<unsigned char>(oneAndTwo.begin(), oneAndTwo.end());
    txTo.vin[4].scriptSig << std::vector<unsigned char>(fifteenSigops.begin(), fifteenSigops.end());

    BOOST_CHECK(::AreInputsStandard(CTransaction(txTo), coins));
    // 22 P2SH sigops for all inputs (1 for vin[0], 6 for vin[3], 15 for vin[4]
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txTo), coins), 22U);

    CMutableTransaction txToNonStd1;
    txToNonStd1.vout.resize(1);
    txToNonStd1.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    txToNonStd1.vout[0].nValue = 1000;
    txToNonStd1.vin.resize(1);
    txToNonStd1.vin[0].prevout.n = 5;
    txToNonStd1.vin[0].prevout.hash = txFrom.GetHash();
    txToNonStd1.vin[0].scriptSig << std::vector<unsigned char>(sixteenSigops.begin(), sixteenSigops.end());

    BOOST_CHECK(!::AreInputsStandard(CTransaction(txToNonStd1), coins));
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txToNonStd1), coins), 16U);

    CMutableTransaction txToNonStd2;
    txToNonStd2.vout.resize(1);
    txToNonStd2.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    txToNonStd2.vout[0].nValue = 1000;
    txToNonStd2.vin.resize(1);
    txToNonStd2.vin[0].prevout.n = 6;
    txToNonStd2.vin[0].prevout.hash = txFrom.GetHash();
    txToNonStd2.vin[0].scriptSig << std::vector<unsigned char>(twentySigops.begin(), twentySigops.end());

    BOOST_CHECK(!::AreInputsStandard(CTransaction(txToNonStd2), coins));
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txToNonStd2), coins), 20U);
}